

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

int mpz_div_qr(__mpz_struct *q,__mpz_struct *r,__mpz_struct *n,__mpz_struct *d,
              mpz_div_round_mode mode)

{
  mp_limb_t *pmVar1;
  uint uVar2;
  __mpz_struct *p_Var3;
  undefined8 uVar4;
  mp_limb_t mVar5;
  mp_size_t mVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  mp_srcptr dp;
  ulong nn;
  ulong uVar10;
  __mpz_struct local_b8;
  __mpz_struct *local_a0;
  __mpz_struct *local_98;
  mp_ptr local_90;
  mp_limb_t *local_88;
  uint local_80;
  mpz_div_round_mode local_7c;
  __mpz_struct local_78;
  mp_limb_t *local_60;
  long local_58;
  gmp_div_inverse inv;
  
  uVar8 = (ulong)d->_mp_size;
  if (uVar8 == 0) {
    gmp_die("mpz_div_qr: Divide by zero.");
  }
  uVar9 = n->_mp_size;
  uVar10 = (ulong)(int)uVar9;
  if (uVar9 == 0) {
    if (q != (__mpz_struct *)0x0) {
      q->_mp_size = 0;
    }
    uVar9 = 0;
    if (r != (__mpz_struct *)0x0) {
      r->_mp_size = 0;
    }
  }
  else {
    nn = -uVar10;
    if (0 < (long)uVar10) {
      nn = uVar10;
    }
    uVar10 = -uVar8;
    if (0 < (long)uVar8) {
      uVar10 = uVar8;
    }
    uVar2 = d->_mp_size ^ uVar9;
    local_a0 = r;
    if (nn < uVar10) {
      if ((int)uVar2 < 0 || mode != GMP_DIV_CEIL) {
        if ((int)uVar2 < 0 && mode == GMP_DIV_FLOOR) {
          if (r != (__mpz_struct *)0x0) {
            mpz_add(r,n,d);
          }
          uVar9 = 1;
          if (q != (__mpz_struct *)0x0) {
            mpz_set_si(q,-1);
          }
        }
        else {
          if (r != (__mpz_struct *)0x0) {
            mpz_set(r,n);
          }
          uVar9 = 1;
          if (q != (__mpz_struct *)0x0) {
            q->_mp_size = 0;
          }
        }
      }
      else {
        if (r != (__mpz_struct *)0x0) {
          mpz_sub(r,n,d);
        }
        uVar9 = 1;
        if (q != (__mpz_struct *)0x0) {
          mpz_set_ui(q,1);
        }
      }
    }
    else {
      local_98 = d;
      local_7c = mode;
      mpz_init_set(&local_b8,n);
      local_60 = local_b8._mp_d;
      local_58 = (nn - uVar10) + 1;
      if (q == (__mpz_struct *)0x0) {
        local_88 = (mp_limb_t *)0x0;
      }
      else {
        mpz_init2(&local_78,local_58 * 0x40);
        local_88 = local_78._mp_d;
      }
      dp = local_98->_mp_d;
      mpn_div_qr_invert(&inv,dp,uVar10);
      if (inv.shift == 0 || uVar10 < 3) {
        local_90 = (mp_ptr)0x0;
      }
      else {
        local_80 = inv.shift;
        local_90 = (mp_ptr)(*gmp_allocate_func)(uVar10 * 8);
        mVar5 = mpn_lshift(local_90,dp,uVar10,local_80);
        dp = local_90;
        if (mVar5 != 0) {
          __assert_fail("__cy == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                        ,0x480,"void mpn_div_qr(mp_ptr, mp_ptr, mp_size_t, mp_srcptr, mp_size_t)");
        }
      }
      mpn_div_qr_preinv(local_88,local_60,nn,dp,uVar10,&inv);
      if (local_90 != (mp_ptr)0x0) {
        (*gmp_free_func)(local_90,0);
      }
      if (local_88 != (mp_ptr)0x0) {
        iVar7 = (int)local_58 - (uint)(local_88[nn - uVar10] == 0);
        local_78._mp_size = -iVar7;
        if (-1 < (int)uVar2) {
          local_78._mp_size = iVar7;
        }
      }
      mVar6 = mpn_normalized_size(local_60,uVar10);
      p_Var3 = local_a0;
      local_b8._mp_size = -(int)mVar6;
      if (-1 < (int)uVar9) {
        local_b8._mp_size = (int)mVar6;
      }
      if (((local_7c == GMP_DIV_FLOOR) && ((int)uVar2 < 0)) && (mVar6 != 0)) {
        if (q != (__mpz_struct *)0x0) {
          mpz_sub_ui(&local_78,&local_78,1);
        }
        if (p_Var3 != (__mpz_struct *)0x0) {
          mpz_add(&local_b8,&local_b8,local_98);
        }
      }
      else if ((-1 < (int)uVar2 && local_7c == GMP_DIV_CEIL) && mVar6 != 0) {
        if (q != (__mpz_struct *)0x0) {
          mpz_add_ui(&local_78,&local_78,1);
        }
        if (p_Var3 != (__mpz_struct *)0x0) {
          mpz_sub(&local_b8,&local_b8,local_98);
        }
      }
      if (q != (__mpz_struct *)0x0) {
        iVar7 = q->_mp_alloc;
        q->_mp_alloc = local_78._mp_alloc;
        q->_mp_size = local_78._mp_size;
        pmVar1 = q->_mp_d;
        q->_mp_d = local_78._mp_d;
        if (iVar7 != 0) {
          (*gmp_free_func)(pmVar1,0);
        }
      }
      iVar7 = local_b8._mp_alloc;
      uVar4 = local_b8._0_8_;
      if (p_Var3 != (__mpz_struct *)0x0) {
        uVar4._0_4_ = p_Var3->_mp_alloc;
        uVar4._4_4_ = p_Var3->_mp_size;
        p_Var3->_mp_size = local_b8._mp_size;
        p_Var3->_mp_alloc = local_b8._mp_alloc;
        pmVar1 = p_Var3->_mp_d;
        p_Var3->_mp_d = local_b8._mp_d;
        iVar7 = (int)uVar4;
        local_b8._mp_d = pmVar1;
      }
      local_b8._0_8_ = uVar4;
      if (iVar7 != 0) {
        (*gmp_free_func)(local_b8._mp_d,0);
      }
      uVar9 = (uint)(mVar6 != 0);
    }
  }
  return uVar9;
}

Assistant:

static int
mpz_div_qr (mpz_t q, mpz_t r,
	    const mpz_t n, const mpz_t d, enum mpz_div_round_mode mode)
{
  mp_size_t ns, ds, nn, dn, qs;
  ns = n->_mp_size;
  ds = d->_mp_size;

  if (ds == 0)
    gmp_die("mpz_div_qr: Divide by zero.");

  if (ns == 0)
    {
      if (q)
	q->_mp_size = 0;
      if (r)
	r->_mp_size = 0;
      return 0;
    }

  nn = GMP_ABS (ns);
  dn = GMP_ABS (ds);

  qs = ds ^ ns;

  if (nn < dn)
    {
      if (mode == GMP_DIV_CEIL && qs >= 0)
	{
	  /* q = 1, r = n - d */
	  if (r)
	    mpz_sub (r, n, d);
	  if (q)
	    mpz_set_ui (q, 1);
	}
      else if (mode == GMP_DIV_FLOOR && qs < 0)
	{
	  /* q = -1, r = n + d */
	  if (r)
	    mpz_add (r, n, d);
	  if (q)
	    mpz_set_si (q, -1);
	}
      else
	{
	  /* q = 0, r = d */
	  if (r)
	    mpz_set (r, n);
	  if (q)
	    q->_mp_size = 0;
	}
      return 1;
    }
  else
    {
      mp_ptr np, qp;
      mp_size_t qn, rn;
      mpz_t tq, tr;

      mpz_init_set (tr, n);
      np = tr->_mp_d;

      qn = nn - dn + 1;

      if (q)
	{
	  mpz_init2 (tq, qn * GMP_LIMB_BITS);
	  qp = tq->_mp_d;
	}
      else
	qp = NULL;

      mpn_div_qr (qp, np, nn, d->_mp_d, dn);

      if (qp)
	{
	  qn -= (qp[qn-1] == 0);

	  tq->_mp_size = qs < 0 ? -qn : qn;
	}
      rn = mpn_normalized_size (np, dn);
      tr->_mp_size = ns < 0 ? - rn : rn;

      if (mode == GMP_DIV_FLOOR && qs < 0 && rn != 0)
	{
	  if (q)
	    mpz_sub_ui (tq, tq, 1);
	  if (r)
	    mpz_add (tr, tr, d);
	}
      else if (mode == GMP_DIV_CEIL && qs >= 0 && rn != 0)
	{
	  if (q)
	    mpz_add_ui (tq, tq, 1);
	  if (r)
	    mpz_sub (tr, tr, d);
	}

      if (q)
	{
	  mpz_swap (tq, q);
	  mpz_clear (tq);
	}
      if (r)
	mpz_swap (tr, r);

      mpz_clear (tr);

      return rn != 0;
    }
}